

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# directory.cpp
# Opt level: O1

StrList * DirUtils::GetDirFiles(StrList *__return_storage_ptr__,string *p)

{
  size_t *psVar1;
  DIR *__dirp;
  dirent *pdVar2;
  size_t sVar3;
  _List_node_base *p_Var4;
  _List_node_base *local_50;
  _List_node_base *local_48;
  _List_node_base local_40;
  
  (__return_storage_ptr__->
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)__return_storage_ptr__;
  (__return_storage_ptr__->
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)__return_storage_ptr__;
  (__return_storage_ptr__->
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl._M_node._M_size = 0;
  __dirp = opendir((p->_M_dataplus)._M_p);
  while( true ) {
    pdVar2 = readdir(__dirp);
    if (pdVar2 == (dirent *)0x0) break;
    local_50 = &local_40;
    sVar3 = strlen(pdVar2->d_name);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_50,pdVar2->d_name,pdVar2->d_name + sVar3);
    p_Var4 = (_List_node_base *)operator_new(0x30);
    p_Var4[1]._M_next = p_Var4 + 2;
    if (local_50 == &local_40) {
      p_Var4[2]._M_next = (_List_node_base *)CONCAT71(local_40._M_next._1_7_,local_40._M_next._0_1_)
      ;
      p_Var4[2]._M_prev = local_40._M_prev;
    }
    else {
      p_Var4[1]._M_next = local_50;
      p_Var4[2]._M_next = (_List_node_base *)CONCAT71(local_40._M_next._1_7_,local_40._M_next._0_1_)
      ;
    }
    p_Var4[1]._M_prev = local_48;
    local_48 = (_List_node_base *)0x0;
    local_40._M_next._0_1_ = 0;
    local_50 = &local_40;
    std::__detail::_List_node_base::_M_hook(p_Var4);
    psVar1 = &(__return_storage_ptr__->
              super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl._M_node._M_size;
    *psVar1 = *psVar1 + 1;
    if (local_50 != &local_40) {
      operator_delete(local_50);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

StrList DirUtils::GetDirFiles(const string& p){
	StrList sl;
	DIR* dir = opendir(p.c_str());
	struct dirent *dirp = nullptr;
	while((dirp = readdir(dir)) != NULL){
		sl.push_back(string(dirp->d_name));
	}
	return sl;
}